

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::SwapCoordinates(ON_LineCurve *this,int i,int j)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double t;
  bool rc;
  int j_local;
  int i_local;
  ON_LineCurve *this_local;
  
  t._7_1_ = false;
  if ((((-1 < i) && (i < 3)) && (-1 < j)) && ((j < 3 && (i != j)))) {
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).from,i);
    dVar1 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).from,j);
    dVar2 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).from,i);
    *pdVar3 = dVar2;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).from,j);
    *pdVar3 = dVar1;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).to,i);
    dVar1 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).to,j);
    dVar2 = *pdVar3;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).to,i);
    *pdVar3 = dVar2;
    pdVar3 = ON_3dPoint::operator[](&(this->m_line).to,j);
    *pdVar3 = dVar1;
    t._7_1_ = true;
  }
  return t._7_1_;
}

Assistant:

bool
ON_LineCurve::SwapCoordinates( int i, int j )
{
  bool rc = false;
  if ( i >= 0 && i < 3 && j >= 0 && j < 3 && i != j ) {
    double t = m_line.from[i];
    m_line.from[i] = m_line.from[j];
    m_line.from[j] = t;
    t = m_line.to[i];
    m_line.to[i] = m_line.to[j];
    m_line.to[j] = t;
    rc = true;
  }
  return rc;
}